

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

void CivetServer::urlDecode(char *src,size_t src_len,string *dst,bool is_form_url_encoded)

{
  uint uVar1;
  out_of_range *this;
  undefined7 in_register_00000009;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> buf;
  
  std::vector<char,_std::allocator<char>_>::vector(&buf,src_len + 1,&local_41);
  uVar1 = mg_url_decode(src,(int)src_len,
                        buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                        (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                        (int)CONCAT71(in_register_00000009,is_form_url_encoded));
  if (-1 < (int)uVar1) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)dst,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar1));
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buf.super__Vector_base<char,_std::allocator<char>_>);
    return;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void
CivetServer::urlDecode(const char *src,
                       size_t src_len,
                       std::string &dst,
                       bool is_form_url_encoded)
{
	// assign enough buffer
	std::vector<char> buf(src_len + 1);
	int r = mg_url_decode(src,
	                      static_cast<int>(src_len),
	                      &buf[0],
	                      static_cast<int>(buf.size()),
	                      is_form_url_encoded);
	if (r < 0) {
		// never reach here
		throw std::out_of_range("");
	}
	// dst can contain NUL characters
	dst.assign(buf.begin(), buf.begin() + r);
}